

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variance_impl_ssse3.c
# Opt level: O1

void aom_var_filter_block2d_bil_first_pass_ssse3
               (uint8_t *a,uint16_t *b,uint src_pixels_per_line,uint pixel_step,uint output_height,
               uint output_width,uint8_t *filter)

{
  ulong uVar1;
  undefined8 uVar2;
  uint uVar3;
  long lVar4;
  ushort uVar5;
  ushort uVar8;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar9 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  
  auVar6 = pshuflw(ZEXT216(*(ushort *)filter),ZEXT216(*(ushort *)filter),0);
  uVar5 = auVar6._0_2_;
  auVar7._0_2_ = uVar5 >> 1;
  uVar8 = auVar6._2_2_;
  auVar7._2_2_ = uVar8 >> 1;
  auVar7._4_2_ = uVar5 >> 1;
  auVar7._6_2_ = uVar8 >> 1;
  auVar7._8_2_ = uVar5 >> 1;
  auVar7._10_2_ = uVar8 >> 1;
  auVar7._12_2_ = uVar5 >> 1;
  auVar7._14_2_ = uVar8 >> 1;
  auVar7 = auVar7 & _DAT_00c1e0d0;
  if (output_width < 8) {
    if (output_height != 0) {
      do {
        auVar6._8_8_ = 0;
        auVar6._0_8_ = *(ulong *)a;
        auVar6 = pshufb(auVar6,ZEXT816(0x403030202010100));
        auVar6 = pmaddubsw(auVar6,auVar7);
        auVar18._0_2_ = auVar6._0_2_ + 0x20;
        auVar18._2_2_ = auVar6._2_2_ + 0x20;
        auVar18._4_2_ = auVar6._4_2_ + 0x20;
        auVar18._6_2_ = auVar6._6_2_ + 0x20;
        auVar18._8_2_ = auVar6._8_2_ + 0x20;
        auVar18._10_2_ = auVar6._10_2_ + 0x20;
        auVar18._12_2_ = auVar6._12_2_ + 0x20;
        auVar18._14_2_ = auVar6._14_2_ + 0x20;
        auVar6 = psraw(auVar18,6);
        *(long *)b = auVar6._0_8_;
        a = (uint8_t *)((long)a + (ulong)src_pixels_per_line);
        b = b + output_width;
        output_height = output_height - 1;
      } while (output_height != 0);
    }
  }
  else if (output_height != 0) {
    uVar3 = 0;
    do {
      lVar4 = 0;
      do {
        uVar1 = *(ulong *)(a + lVar4);
        uVar2 = *(undefined8 *)(a + lVar4 + 1);
        auVar16._8_6_ = 0;
        auVar16._0_8_ = uVar1;
        auVar16[0xe] = (char)(uVar1 >> 0x38);
        auVar16[0xf] = (char)((ulong)uVar2 >> 0x38);
        auVar15._14_2_ = auVar16._14_2_;
        auVar15._8_5_ = 0;
        auVar15._0_8_ = uVar1;
        auVar15[0xd] = (char)((ulong)uVar2 >> 0x30);
        auVar14._13_3_ = auVar15._13_3_;
        auVar14._8_4_ = 0;
        auVar14._0_8_ = uVar1;
        auVar14[0xc] = (char)(uVar1 >> 0x30);
        auVar13._12_4_ = auVar14._12_4_;
        auVar13._8_3_ = 0;
        auVar13._0_8_ = uVar1;
        auVar13[0xb] = (char)((ulong)uVar2 >> 0x28);
        auVar12._11_5_ = auVar13._11_5_;
        auVar12._8_2_ = 0;
        auVar12._0_8_ = uVar1;
        auVar12[10] = (char)(uVar1 >> 0x28);
        auVar11._10_6_ = auVar12._10_6_;
        auVar11[8] = 0;
        auVar11._0_8_ = uVar1;
        auVar11[9] = (char)((ulong)uVar2 >> 0x20);
        auVar10._9_7_ = auVar11._9_7_;
        auVar10[8] = (char)(uVar1 >> 0x20);
        auVar10._0_8_ = uVar1;
        auVar9._8_8_ = auVar10._8_8_;
        auVar9[7] = (char)((ulong)uVar2 >> 0x18);
        auVar9[6] = (char)(uVar1 >> 0x18);
        auVar9[5] = (char)((ulong)uVar2 >> 0x10);
        auVar9[4] = (char)(uVar1 >> 0x10);
        auVar9[3] = (char)((ulong)uVar2 >> 8);
        auVar9[2] = (char)(uVar1 >> 8);
        auVar9[0] = (undefined1)uVar1;
        auVar9[1] = (char)uVar2;
        auVar6 = pmaddubsw(auVar9,auVar7);
        auVar17._0_2_ = auVar6._0_2_ + 0x20;
        auVar17._2_2_ = auVar6._2_2_ + 0x20;
        auVar17._4_2_ = auVar6._4_2_ + 0x20;
        auVar17._6_2_ = auVar6._6_2_ + 0x20;
        auVar17._8_2_ = auVar6._8_2_ + 0x20;
        auVar17._10_2_ = auVar6._10_2_ + 0x20;
        auVar17._12_2_ = auVar6._12_2_ + 0x20;
        auVar17._14_2_ = auVar6._14_2_ + 0x20;
        auVar6 = psraw(auVar17,6);
        *(undefined1 (*) [16])b = auVar6;
        b = (uint16_t *)((long)b + 0x10);
        lVar4 = lVar4 + 8;
      } while ((uint)lVar4 < output_width);
      a = a + lVar4 + (ulong)(src_pixels_per_line - output_width);
      uVar3 = uVar3 + 1;
    } while (uVar3 != output_height);
  }
  return;
}

Assistant:

void aom_var_filter_block2d_bil_first_pass_ssse3(
    const uint8_t *a, uint16_t *b, unsigned int src_pixels_per_line,
    unsigned int pixel_step, unsigned int output_height,
    unsigned int output_width, const uint8_t *filter) {
  // Note: filter[0], filter[1] could be {128, 0}, where 128 will overflow
  // in computation using _mm_maddubs_epi16.
  // Change {128, 0} to {64, 0} and reduce FILTER_BITS by 1 to avoid overflow.
  const int16_t round = (1 << (FILTER_BITS - 1)) >> 1;
  const __m128i r = _mm_set1_epi16(round);
  const int8_t f0 = (int8_t)(filter[0] >> 1);
  const int8_t f1 = (int8_t)(filter[1] >> 1);
  const __m128i filters = _mm_setr_epi8(f0, f1, f0, f1, f0, f1, f0, f1, f0, f1,
                                        f0, f1, f0, f1, f0, f1);
  unsigned int i, j;
  (void)pixel_step;

  if (output_width >= 8) {
    for (i = 0; i < output_height; ++i) {
      for (j = 0; j < output_width; j += 8) {
        // load source
        __m128i source_low = xx_loadl_64(a);
        __m128i source_hi = xx_loadl_64(a + 1);

        // unpack to:
        // { a[0], a[1], a[1], a[2], a[2], a[3], a[3], a[4],
        //   a[4], a[5], a[5], a[6], a[6], a[7], a[7], a[8] }
        __m128i source = _mm_unpacklo_epi8(source_low, source_hi);

        // b[i] = a[i] * filter[0] + a[i + 1] * filter[1]
        __m128i res = _mm_maddubs_epi16(source, filters);

        // round
        res = _mm_srai_epi16(_mm_add_epi16(res, r), FILTER_BITS - 1);

        xx_storeu_128(b, res);

        a += 8;
        b += 8;
      }

      a += src_pixels_per_line - output_width;
    }
  } else {
    const __m128i shuffle_mask =
        _mm_setr_epi8(0, 1, 1, 2, 2, 3, 3, 4, 4, 5, 5, 6, 6, 7, 7, 8);
    for (i = 0; i < output_height; ++i) {
      // load source, only first 5 values are meaningful:
      // { a[0], a[1], a[2], a[3], a[4], xxxx }
      __m128i source = xx_loadl_64(a);

      // shuffle, up to the first 8 are useful
      // { a[0], a[1], a[1], a[2], a[2], a[3], a[3], a[4],
      //   a[4], a[5], a[5], a[6], a[6], a[7], a[7], a[8] }
      __m128i source_shuffle = _mm_shuffle_epi8(source, shuffle_mask);

      __m128i res = _mm_maddubs_epi16(source_shuffle, filters);
      res = _mm_srai_epi16(_mm_add_epi16(res, r), FILTER_BITS - 1);

      xx_storel_64(b, res);

      a += src_pixels_per_line;
      b += output_width;
    }
  }
}